

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::AddSegmentAsFallback<segment_command,section>
               (string_view command_data,string_view file_data,RangeSink *sink)

{
  uint uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  uint uVar4;
  segment_command *psVar5;
  section *s;
  uint32_t uVar6;
  size_t off;
  RangeSink *vmaddr;
  char *maxlen;
  string_view name;
  string_view name_00;
  string_view data;
  string_view data_00;
  allocator<char> local_fd;
  uint32_t local_fc;
  RangeSink *local_f8;
  bloaty *local_f0;
  char *local_e8;
  string_view local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string label;
  string_view segname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_view local_60;
  string_view local_50;
  string_view command_data_local;
  
  local_e8 = file_data._M_str;
  local_f0 = (bloaty *)file_data._M_len;
  maxlen = command_data._M_str;
  command_data_local._M_len = command_data._M_len;
  local_f8 = sink;
  command_data_local._M_str = maxlen;
  psVar5 = GetStructPointerAndAdvance<segment_command>(&command_data_local);
  if (psVar5->maxprot != 0) {
    segname = ArrayToStr(psVar5->segname,(size_t)maxlen);
    uVar6 = psVar5->nsects;
    while( true ) {
      if (uVar6 == 0) break;
      s = GetStructPointerAndAdvance<section>(&command_data_local);
      off = (size_t)s->size;
      uVar4 = (uint)(byte)s->flags;
      if ((uVar4 < 0x13) && ((0x41002U >> (uVar4 & 0x1f) & 1) != 0)) {
        off = 0;
      }
      local_e0 = ArrayToStr(s->sectname,(size_t)maxlen);
      local_d0._M_allocated_capacity._0_4_ = (undefined4)segname._M_len;
      local_d0._M_allocated_capacity._4_4_ = segname._M_len._4_4_;
      local_d0._8_4_ = segname._M_str._0_4_;
      local_d0._12_4_ = segname._M_str._4_4_;
      absl::strings_internal::
      JoinTuple<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,0ul,1ul>
                (&label,(strings_internal *)&local_e0,1,",");
      std::operator+(&local_80,"[",&label);
      local_fc = uVar6 - 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                     &local_80,"]");
      std::__cxx11::string::operator=((string *)&label,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_80);
      sVar3 = label._M_string_length;
      _Var2 = label._M_dataplus;
      vmaddr = (RangeSink *)(ulong)s->addr;
      uVar4 = s->size;
      data._M_str._0_4_ = s->offset;
      data._M_len = (size_t)local_e8;
      data._M_str._4_4_ = 0;
      local_50 = StrictSubstr(local_f0,data,off,(size_t)sink);
      maxlen = "macho_fallback";
      name._M_str = _Var2._M_p;
      name._M_len = sVar3;
      RangeSink::AddRange(local_f8,"macho_fallback",name,(uint64_t)vmaddr,(ulong)uVar4,local_50);
      std::__cxx11::string::~string((string *)&label);
      sink = vmaddr;
      uVar6 = local_fc;
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_80,&segname,&local_fd);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                   "[",&local_80);
    std::operator+(&label,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_e0,"]");
    uVar4 = psVar5->vmaddr;
    uVar1 = psVar5->vmsize;
    data_00._M_str._0_4_ = psVar5->fileoff;
    data_00._M_len = (size_t)local_e8;
    data_00._M_str._4_4_ = 0;
    local_60 = StrictSubstr(local_f0,data_00,(ulong)psVar5->filesize,(size_t)sink);
    name_00._M_str = label._M_dataplus._M_p;
    name_00._M_len = label._M_string_length;
    RangeSink::AddRange(local_f8,"macho_fallback",name_00,(ulong)uVar4,(ulong)uVar1,local_60);
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void AddSegmentAsFallback(string_view command_data, string_view file_data,
                          RangeSink* sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&command_data);

  if (segment->maxprot == VM_PROT_NONE) {
    return;
  }

  string_view segname = ArrayToStr(segment->segname, 16);

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&command_data);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    std::string label = absl::StrJoin(
        std::make_tuple(segname, ArrayToStr(section->sectname, 16)), ",");
    label = "[" + label + "]";
    sink->AddRange("macho_fallback", label, section->addr, section->size,
                   StrictSubstr(file_data, section->offset, filesize));
  }

  sink->AddRange("macho_fallback", "[" + std::string(segname) + "]",
                 segment->vmaddr, segment->vmsize,
                 StrictSubstr(file_data, segment->fileoff, segment->filesize));
}